

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.c
# Opt level: O0

void FormatCmdHelp(char *buffer,ECommand_t cmd,char *description)

{
  size_t sVar1;
  char local_42 [8];
  char keyBuf2 [10];
  char keyBuf [20];
  char *description_local;
  ECommand_t cmd_local;
  char *buffer_local;
  
  FormatKey(keyBuf2 + 2,DefaultKeys[cmd]);
  if (DefaultKeys[cmd] != SecondaryKeys[cmd]) {
    FormatKey(local_42,SecondaryKeys[cmd]);
    strcat(keyBuf2 + 2," or ");
    strcat(keyBuf2 + 2,local_42);
  }
  sVar1 = strlen(buffer);
  sprintf(buffer + sVar1,"  %-10s .. %s\n",keyBuf2 + 2,description);
  return;
}

Assistant:

static void FormatCmdHelp(char* buffer, ECommand_t cmd, const char* description)
{
  char keyBuf[20];
  FormatKey(keyBuf, DefaultKeys[cmd]);

  if (DefaultKeys[cmd] != SecondaryKeys[cmd]) {
    char keyBuf2[10];
    FormatKey(keyBuf2, SecondaryKeys[cmd]);
    strcat(keyBuf, " or ");
    strcat(keyBuf, keyBuf2);
  }

  sprintf(&buffer[strlen(buffer)], "  %-10s .. %s\n", keyBuf, description);
}